

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::InjectConstraints
          (ChLinkMateGeneric *this,ChSystemDescriptor *mdescriptor)

{
  int iVar1;
  ChConstraintTwoBodies *pCVar2;
  int i;
  
  iVar1 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    for (iVar1 = 0; iVar1 < (this->mask).nconstr; iVar1 = iVar1 + 1) {
      pCVar2 = ChLinkMask::Constr_N(&this->mask,iVar1);
      if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pCVar2 = ChLinkMask::Constr_N(&this->mask,iVar1);
        (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,pCVar2);
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::InjectConstraints(ChSystemDescriptor& mdescriptor) {
    if (!this->IsActive())
        return;

    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive())
            mdescriptor.InsertConstraint(&mask.Constr_N(i));
    }
}